

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

bool __thiscall serial::Serial::SerialImpl::waitForChange(SerialImpl *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  SerialException *this_00;
  int command;
  char *local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  iVar1 = ioctl(this->fd_,0x545c);
  if (iVar1 != -1) {
    return true;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"waitForDSR failed on a call to ioctl(TIOCMIWAIT): ");
  piVar3 = __errno_location();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*piVar3);
  poVar2 = std::operator<<(poVar2," ");
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  this_00 = (SerialException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  SerialException::SerialException(this_00,local_1c0);
  __cxa_throw(this_00,&SerialException::typeinfo,SerialException::~SerialException);
}

Assistant:

bool
Serial::SerialImpl::waitForChange ()
{
#ifndef TIOCMIWAIT

while (is_open_ == true) {

    int status;

    if (-1 == ioctl (fd_, TIOCMGET, &status))
    {
        stringstream ss;
        ss << "waitForChange failed on a call to ioctl(TIOCMGET): " << errno << " " << strerror(errno);
        throw(SerialException(ss.str().c_str()));
    }
    else
    {
        if (0 != (status & TIOCM_CTS)
         || 0 != (status & TIOCM_DSR)
         || 0 != (status & TIOCM_RI)
         || 0 != (status & TIOCM_CD))
        {
          return true;
        }
    }

    usleep(1000);
  }

  return false;
#else
  int command = (TIOCM_CD|TIOCM_DSR|TIOCM_RI|TIOCM_CTS);

  if (-1 == ioctl (fd_, TIOCMIWAIT, &command)) {
    stringstream ss;
    ss << "waitForDSR failed on a call to ioctl(TIOCMIWAIT): "
       << errno << " " << strerror(errno);
    throw(SerialException(ss.str().c_str()));
  }
  return true;
#endif
}